

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsLink.cpp
# Opt level: O0

bool Js::ASMLink::CheckFFI(ScriptContext *scriptContext,AsmJsModuleInfo *info,Var foreign)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  TypeId typeId;
  undefined4 *puVar4;
  RecyclableObject *this;
  TypeId foreignObjType;
  Var foreign_local;
  AsmJsModuleInfo *info_local;
  ScriptContext *scriptContext_local;
  
  iVar3 = AsmJsModuleInfo::GetFunctionImportCount(info);
  if ((iVar3 == 0) && (iVar3 = AsmJsModuleInfo::GetVarImportCount(info), iVar3 == 0)) {
    return true;
  }
  if (foreign == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsLink.cpp"
                                ,0x2c,"(foreign)","foreign");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = VarIs<Js::RecyclableObject>(foreign);
  if (bVar2) {
    this = VarTo<Js::RecyclableObject>(foreign);
    typeId = RecyclableObject::GetTypeId(this);
    bVar2 = StaticType::Is(typeId);
    if ((bVar2) || (typeId == TypeIds_Proxy)) {
      AsmJSCompiler::OutputError(scriptContext,L"Asm.js Runtime Error : FFI is not an object");
      scriptContext_local._7_1_ = false;
    }
    else {
      scriptContext_local._7_1_ = true;
    }
  }
  else {
    AsmJSCompiler::OutputError(scriptContext,L"Asm.js Runtime Error : FFI is not an object");
    scriptContext_local._7_1_ = false;
  }
  return scriptContext_local._7_1_;
}

Assistant:

bool ASMLink::CheckFFI(ScriptContext* scriptContext, AsmJsModuleInfo* info, const Var foreign)
    {
        if (info->GetFunctionImportCount() == 0 && info->GetVarImportCount() == 0)
        {
            return true;
        }
        Assert(foreign);
        if (!VarIs<RecyclableObject>(foreign))
        {
            AsmJSCompiler::OutputError(scriptContext, _u("Asm.js Runtime Error : FFI is not an object"));
            return false;
        }
        TypeId foreignObjType = VarTo<RecyclableObject>(foreign)->GetTypeId();
        if (StaticType::Is(foreignObjType) || TypeIds_Proxy == foreignObjType)
        {
            AsmJSCompiler::OutputError(scriptContext, _u("Asm.js Runtime Error : FFI is not an object"));
            return false;
        }
        return true;
    }